

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

void __thiscall
TPZSparseBlockDiagonal<float>::UpdateFrom
          (TPZSparseBlockDiagonal<float> *this,TPZAutoPointer<TPZMatrix<float>_> *mat)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  TPZMatrix<float> *pTVar6;
  long lVar7;
  long newsize;
  long lVar8;
  TPZFMatrix<float> block;
  TPZFMatrix<float> local_2020;
  TPZManVector<long,_1000> local_1f90;
  
  if ((mat->fRef != (TPZReference *)0x0) && (mat->fRef->fPointer != (TPZMatrix<float> *)0x0)) {
    (this->super_TPZBlockDiagonal<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed =
         '\0';
    lVar2 = (this->super_TPZBlockDiagonal<float>).fBlockSize.fNElements;
    TPZVec<long>::TPZVec(&local_1f90.super_TPZVec<long>,0);
    local_1f90.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0185c8c0;
    local_1f90.super_TPZVec<long>.fStore = local_1f90.fExtAlloc;
    local_1f90.super_TPZVec<long>.fNElements = 0;
    local_1f90.super_TPZVec<long>.fNAlloc = 0;
    if (0 < lVar2) {
      lVar7 = 0;
      do {
        iVar1 = (this->super_TPZBlockDiagonal<float>).fBlockSize.fStore[lVar7];
        newsize = (long)iVar1;
        TPZManVector<long,_1000>::Resize(&local_1f90,newsize);
        lVar3 = (this->super_TPZBlockDiagonal<float>).fBlockPos.fStore[lVar7];
        if (0 < iVar1) {
          plVar4 = (this->fBlock).fStore;
          plVar5 = (this->fBlockIndex).fStore;
          lVar8 = 0;
          do {
            local_1f90.super_TPZVec<long>.fStore[lVar8] = plVar4[plVar5[lVar7] + lVar8];
            lVar8 = lVar8 + 1;
          } while (newsize != lVar8);
        }
        local_2020.fElem = (this->super_TPZBlockDiagonal<float>).fStorage.fStore + lVar3;
        local_2020.fSize = newsize * newsize;
        local_2020.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_2020.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_2020.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0181dbe8;
        local_2020.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = newsize;
        local_2020.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = newsize;
        local_2020.fGiven = local_2020.fElem;
        TPZVec<int>::TPZVec(&local_2020.fPivot.super_TPZVec<int>,0);
        local_2020.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498
        ;
        local_2020.fPivot.super_TPZVec<int>.fStore = local_2020.fPivot.fExtAlloc;
        local_2020.fPivot.super_TPZVec<int>.fNElements = 0;
        local_2020.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_2020.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
        local_2020.fWork.fStore = (float *)0x0;
        local_2020.fWork.fNElements = 0;
        local_2020.fWork.fNAlloc = 0;
        if (iVar1 == 0) {
          local_2020.fElem = (float *)0x0;
        }
        pTVar6 = mat->fRef->fPointer;
        (*(pTVar6->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x49])
                  (pTVar6,&local_1f90,&local_2020);
        TPZFMatrix<float>::~TPZFMatrix(&local_2020);
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar2);
      if (local_1f90.super_TPZVec<long>.fStore != local_1f90.fExtAlloc) {
        local_1f90.super_TPZVec<long>.fNAlloc = 0;
        local_1f90.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_1f90.super_TPZVec<long>.fStore != (long *)0x0) {
          operator_delete__(local_1f90.super_TPZVec<long>.fStore);
        }
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "virtual void TPZSparseBlockDiagonal<float>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar>>) [TVar = float]"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," called with zero argument\n",0x1b);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::UpdateFrom");
#endif
	if(!mat) 
	{
		cout << __PRETTY_FUNCTION__ << " called with zero argument\n";
		return;
	}
	this->fDecomposed = ENoDecompose;
	int64_t nblock = this->fBlockSize.NElements();
	int64_t b,bsize,pos;
	TPZManVector<int64_t,1000> indices;
	for(b=0; b<nblock; b++) {
		bsize = this->fBlockSize[b];
		indices.Resize(bsize);
		int64_t r;
		pos = this->fBlockPos[b];
		for(r=0; r<bsize; r++) indices[r] = fBlock[fBlockIndex[b]+r]; 
		TPZFMatrix<TVar> block(bsize,bsize,&this->fStorage[pos],bsize*bsize);
		mat->GetSub(indices,block);
	}
	
}